

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyMemBackendRelease(SyMemBackend *pBackend)

{
  sxi32 sVar1;
  sxi32 rc;
  SyMemBackend *pBackend_local;
  
  if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
    (*pBackend->pMutexMethods->xEnter)(pBackend->pMutex);
  }
  sVar1 = MemBackendRelease(pBackend);
  if (pBackend->pMutexMethods != (SyMutexMethods *)0x0) {
    if (pBackend->pMutex != (SyMutex *)0x0) {
      (*pBackend->pMutexMethods->xLeave)(pBackend->pMutex);
    }
    if ((pBackend->pMutex != (SyMutex *)0x0) &&
       (pBackend->pMutexMethods->xRelease != (_func_void_SyMutex_ptr *)0x0)) {
      (*pBackend->pMutexMethods->xRelease)(pBackend->pMutex);
    }
  }
  return sVar1;
}

Assistant:

JX9_PRIVATE sxi32 SyMemBackendRelease(SyMemBackend *pBackend)
{
	sxi32 rc;
#if defined(UNTRUST)
	if( SXMEM_BACKEND_CORRUPT(pBackend) ){
		return SXERR_INVALID;
	}
#endif
	if( pBackend->pMutexMethods ){
		SyMutexEnter(pBackend->pMutexMethods, pBackend->pMutex);
	}
	rc = MemBackendRelease(&(*pBackend));
	if( pBackend->pMutexMethods ){
		SyMutexLeave(pBackend->pMutexMethods, pBackend->pMutex);
		SyMutexRelease(pBackend->pMutexMethods, pBackend->pMutex);
	}
	return rc;
}